

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O0

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                   *B)

{
  double dVar1;
  bool bVar2;
  key_type *pkVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_RSI;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  *in_RDI;
  const_iterator it;
  size_t i;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_stack_ffffffffffffffa8;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *A_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  _Self local_28;
  _Self local_20;
  key_type *pkVar6;
  key_type *__k;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *this;
  
  A_00 = in_RSI;
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::size(in_RDI);
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::resize((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)in_RSI);
  pkVar6 = (key_type *)0x0;
  while( true ) {
    __k = pkVar6;
    pkVar3 = (key_type *)
             std::
             vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
             ::size(in_RDI);
    if (pkVar3 <= pkVar6) break;
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::operator[](in_RDI,(size_type)__k);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    while( true ) {
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](in_RDI,(size_type)__k);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::end(in_stack_ffffffffffffffa8);
      bVar2 = std::operator!=(&local_20,&local_28);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                          0x104004);
      dVar1 = ppVar4->second;
      this = A_00;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                          0x104023);
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[]((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                    *)A_00,(ulong)ppVar4->first);
      pmVar5 = std::
               map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
               ::operator[](this,__k);
      *pmVar5 = dVar1;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)A_00);
      A_00 = this;
    }
    pkVar6 = (key_type *)((long)__k + 1);
  }
  do_nothing((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
              *)A_00);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}